

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O3

SUNErrCode SUNProfiler_Free(SUNProfiler *p)

{
  if ((p != (SUNProfiler *)0x0) && (*p != (SUNProfiler)0x0)) {
    SUNHashMap_Destroy(&(*p)->map);
    sunTimerStructFree((*p)->overhead);
    free((*p)->title);
    free(*p);
    *p = (SUNProfiler)0x0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNProfiler_Free(SUNProfiler* p)
{
  if (!p || !(*p)) { return SUN_SUCCESS; }

  SUNDIALS_MARK_END(*p, SUNDIALS_ROOT_TIMER);

  if (*p)
  {
    SUNHashMap_Destroy(&(*p)->map);
    sunTimerStructFree((void*)(*p)->overhead);
#if SUNDIALS_MPI_ENABLED
    if ((*p)->comm != SUN_COMM_NULL) { MPI_Comm_free(&(*p)->comm); }
#endif
    free((*p)->title);
    free(*p);
  }
  *p = NULL;

  return SUN_SUCCESS;
}